

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O3

void anon_unknown.dwarf_4ac6::Test_TemplateDictionary_TestShowTemplateGlobalSection_Child::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString *pTVar3;
  string out;
  TemplateDictionary dict;
  undefined7 uStack_11f;
  undefined7 uStack_ff;
  char *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  TemplateString local_d0;
  undefined **local_b0;
  TemplateString *local_a8;
  undefined1 local_a0 [24];
  DataMap *local_88;
  
  local_a0._0_8_ = "test2.tpl";
  local_a0._8_8_ = (TemplateAnnotator *)0x9;
  local_a0[0x10] = true;
  local_88 = (DataMap *)0x0;
  local_d0.ptr_ = "{{#foo}}{{#sect}}OK{{/sect}}{{/foo}}";
  local_d0.length_ = 0x24;
  local_d0.is_immutable_ = true;
  local_d0.id_ = 0;
  pTVar3 = (TemplateString *)ctemplate::mutable_default_template_cache();
  ctemplate::TemplateCache::StringToTemplateCache
            (pTVar3,(TemplateString *)local_a0,(Strip)&local_d0);
  local_d0.ptr_ = "mydict";
  local_d0.length_ = 6;
  local_d0.is_immutable_ = true;
  local_d0.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)local_a0,&local_d0,(UnsafeArena *)0x0);
  TVar1._17_7_ = uStack_ff;
  TVar1.is_immutable_ = true;
  TVar1.length_ = 4;
  TVar1.ptr_ = "sect";
  TVar1.id_ = 0;
  ctemplate::TemplateDictionary::ShowTemplateGlobalSection(TVar1);
  TVar2._17_7_ = uStack_11f;
  TVar2.is_immutable_ = true;
  TVar2.length_ = 3;
  TVar2.ptr_ = "foo";
  TVar2.id_ = 0;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar2);
  local_d0.length_ = 0;
  local_d0.is_immutable_ = false;
  local_f0 = "test2.tpl";
  local_e8 = 9;
  local_e0 = 1;
  local_d8 = 0;
  local_d0.ptr_ = &local_d0.is_immutable_;
  pTVar3 = (TemplateString *)ctemplate::mutable_default_template_cache();
  local_b0 = &PTR__ExpandEmitter_0011dcf8;
  local_a8 = &local_d0;
  ctemplate::TemplateCache::ExpandWithData
            (pTVar3,(Strip)&local_f0,(TemplateDictionaryInterface *)0x0,(PerExpandData *)local_a0,
             (ExpandEmitter *)0x0);
  if ((bool *)local_d0.ptr_ != &local_d0.is_immutable_) {
    operator_delete(local_d0.ptr_);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_a0);
  return;
}

Assistant:

TEST(TemplateDictionary, SetValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // sizeof("not_v") == sizeof("value")
}